

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseErrorTest_MsgReservedIdentifierOnlyInEditions_Test
::~ParseErrorTest_MsgReservedIdentifierOnlyInEditions_Test
          (ParseErrorTest_MsgReservedIdentifierOnlyInEditions_Test *this)

{
  ParseErrorTest_MsgReservedIdentifierOnlyInEditions_Test *this_local;
  
  ~ParseErrorTest_MsgReservedIdentifierOnlyInEditions_Test(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseErrorTest, MsgReservedIdentifierOnlyInEditions) {
  ExpectHasErrors(
      "message TestMessage {\n"
      "  reserved foo, bar;\n"
      "}\n",
      "1:11: Reserved names must be string literals. (Only editions supports "
      "identifiers.)\n");
}